

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O2

ASTNode * AST::ASTBuilder::createCustomNode(string *nodeName,Token *token)

{
  bool bVar1;
  ASTNode *this;
  string *name;
  string sStack_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  name = &sStack_3a8;
  bVar1 = std::operator==(nodeName,"add");
  if (bVar1) {
    this = (ASTNode *)operator_new(200);
    name = &local_48;
    std::__cxx11::string::string((string *)name,(string *)nodeName);
    AddOp::AddOp((AddOp *)this,name,token);
  }
  else {
    bVar1 = std::operator==(nodeName,"ARRAYDIMENSIONS");
    if (bVar1) {
      this = (ASTNode *)operator_new(200);
      name = &local_68;
      std::__cxx11::string::string((string *)name,(string *)nodeName);
      ArrayDim::ArrayDim((ArrayDim *)this,name,token);
    }
    else {
      bVar1 = std::operator==(nodeName,"=");
      if (bVar1) {
        this = (ASTNode *)operator_new(200);
        name = &local_88;
        std::__cxx11::string::string((string *)name,(string *)nodeName);
        AssignOp::AssignOp((AssignOp *)this,name,token);
      }
      else {
        bVar1 = std::operator==(nodeName,"calls");
        if (bVar1) {
          this = (ASTNode *)operator_new(200);
          name = &local_a8;
          std::__cxx11::string::string((string *)name,(string *)nodeName);
          Calls::Calls((Calls *)this,name,token);
        }
        else {
          bVar1 = std::operator==(nodeName,"call");
          if (bVar1) {
            this = (ASTNode *)operator_new(200);
            name = &local_c8;
            std::__cxx11::string::string((string *)name,(string *)nodeName);
            Call::Call((Call *)this,name,token);
          }
          else {
            bVar1 = std::operator==(nodeName,"classes");
            if (bVar1) {
              this = (ASTNode *)operator_new(200);
              name = &local_e8;
              std::__cxx11::string::string((string *)name,(string *)nodeName);
              ClassDecls::ClassDecls((ClassDecls *)this,name,token);
            }
            else {
              bVar1 = std::operator==(nodeName,"class");
              if (bVar1) {
                this = (ASTNode *)operator_new(200);
                name = &local_108;
                std::__cxx11::string::string((string *)name,(string *)nodeName);
                ClassDecl::ClassDecl((ClassDecl *)this,name,token);
              }
              else {
                bVar1 = std::operator==(nodeName,"cmp");
                if (bVar1) {
                  this = (ASTNode *)operator_new(200);
                  name = &local_128;
                  std::__cxx11::string::string((string *)name,(string *)nodeName);
                  CompareOp::CompareOp((CompareOp *)this,name,token);
                }
                else {
                  bVar1 = std::operator==(nodeName,"func_body");
                  if (bVar1) {
                    this = (ASTNode *)operator_new(200);
                    name = &local_148;
                    std::__cxx11::string::string((string *)name,(string *)nodeName);
                    FuncBody::FuncBody((FuncBody *)this,name,token);
                  }
                  else {
                    bVar1 = std::operator==(nodeName,"func_call");
                    if (bVar1) {
                      this = (ASTNode *)operator_new(200);
                      name = &local_168;
                      std::__cxx11::string::string((string *)name,(string *)nodeName);
                      FuncCall::FuncCall((FuncCall *)this,name,token);
                    }
                    else {
                      bVar1 = std::operator==(nodeName,"func_def");
                      if (bVar1) {
                        this = (ASTNode *)operator_new(200);
                        name = &local_188;
                        std::__cxx11::string::string((string *)name,(string *)nodeName);
                        FuncDef::FuncDef((FuncDef *)this,name,token);
                      }
                      else {
                        bVar1 = std::operator==(nodeName,"func_decl");
                        if (bVar1) {
                          this = (ASTNode *)operator_new(200);
                          name = &local_1a8;
                          std::__cxx11::string::string((string *)name,(string *)nodeName);
                          FuncDecl::FuncDecl((FuncDecl *)this,name,token);
                        }
                        else {
                          bVar1 = std::operator==(nodeName,"params");
                          if (bVar1) {
                            this = (ASTNode *)operator_new(200);
                            name = &local_1c8;
                            std::__cxx11::string::string((string *)name,(string *)nodeName);
                            FuncParams::FuncParams((FuncParams *)this,name,token);
                          }
                          else {
                            bVar1 = std::operator==(nodeName,"params_call");
                            if (bVar1) {
                              this = (ASTNode *)operator_new(200);
                              name = &local_1e8;
                              std::__cxx11::string::string((string *)name,(string *)nodeName);
                              FuncCallParams::FuncCallParams((FuncCallParams *)this,name,token);
                            }
                            else {
                              bVar1 = std::operator==(nodeName,"if");
                              if (bVar1) {
                                this = (ASTNode *)operator_new(200);
                                name = &local_208;
                                std::__cxx11::string::string((string *)name,(string *)nodeName);
                                If::If((If *)this,name,token);
                              }
                              else {
                                bVar1 = std::operator==(nodeName,"LOCALSCOPE");
                                if (bVar1) {
                                  this = (ASTNode *)operator_new(200);
                                  name = &local_228;
                                  std::__cxx11::string::string((string *)name,(string *)nodeName);
                                  Local::Local((Local *)this,name,token);
                                }
                                else {
                                  bVar1 = std::operator==(nodeName,"main");
                                  if (bVar1) {
                                    this = (ASTNode *)operator_new(200);
                                    name = &local_248;
                                    std::__cxx11::string::string((string *)name,(string *)nodeName);
                                    MainFunc::MainFunc((MainFunc *)this,name,token);
                                  }
                                  else {
                                    bVar1 = std::operator==(nodeName,"mult");
                                    if (bVar1) {
                                      this = (ASTNode *)operator_new(200);
                                      name = &local_268;
                                      std::__cxx11::string::string
                                                ((string *)name,(string *)nodeName);
                                      MultOp::MultOp((MultOp *)this,name,token);
                                    }
                                    else {
                                      bVar1 = std::operator==(nodeName,"number");
                                      if (bVar1) {
                                        this = (ASTNode *)operator_new(200);
                                        name = &local_288;
                                        std::__cxx11::string::string
                                                  ((string *)name,(string *)nodeName);
                                        Number::Number((Number *)this,name,token);
                                      }
                                      else {
                                        bVar1 = std::operator==(nodeName,"PROGRAM");
                                        if (bVar1) {
                                          this = (ASTNode *)operator_new(200);
                                          name = &local_2a8;
                                          std::__cxx11::string::string
                                                    ((string *)name,(string *)nodeName);
                                          Program::Program((Program *)this,name,token);
                                        }
                                        else {
                                          bVar1 = std::operator==(nodeName,"read");
                                          if (bVar1) {
                                            this = (ASTNode *)operator_new(200);
                                            name = &local_2c8;
                                            std::__cxx11::string::string
                                                      ((string *)name,(string *)nodeName);
                                            Read::Read((Read *)this,name,token);
                                          }
                                          else {
                                            bVar1 = std::operator==(nodeName,"return");
                                            if (bVar1) {
                                              this = (ASTNode *)operator_new(200);
                                              name = &local_2e8;
                                              std::__cxx11::string::string
                                                        ((string *)name,(string *)nodeName);
                                              Return::Return((Return *)this,name,token);
                                            }
                                            else {
                                              bVar1 = std::operator==(nodeName,"sign");
                                              if (bVar1) {
                                                this = (ASTNode *)operator_new(200);
                                                name = &local_308;
                                                std::__cxx11::string::string
                                                          ((string *)name,(string *)nodeName);
                                                Sign::Sign((Sign *)this,name,token);
                                              }
                                              else {
                                                bVar1 = std::operator==(nodeName,"STATEMENTS");
                                                if (!bVar1) {
                                                  bVar1 = std::operator==(nodeName,"STATEMENTBLOCK")
                                                  ;
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(nodeName,"variable");
                                                    if (bVar1) {
                                                      this = (ASTNode *)operator_new(200);
                                                      name = &local_348;
                                                      std::__cxx11::string::string
                                                                ((string *)name,(string *)nodeName);
                                                      VarDecl::VarDecl((VarDecl *)this,name,token);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(nodeName,"while");
                                                      if (bVar1) {
                                                        this = (ASTNode *)operator_new(200);
                                                        name = &local_368;
                                                        std::__cxx11::string::string
                                                                  ((string *)name,(string *)nodeName
                                                                  );
                                                        While::While((While *)this,name,token);
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(nodeName,"write");
                                                        this = (ASTNode *)operator_new(200);
                                                        if (bVar1) {
                                                          name = &local_388;
                                                          std::__cxx11::string::string
                                                                    ((string *)name,
                                                                     (string *)nodeName);
                                                          Write::Write((Write *)this,name,token);
                                                        }
                                                        else {
                                                          std::__cxx11::string::string
                                                                    ((string *)&sStack_3a8,
                                                                     (string *)nodeName);
                                                          ASTNode::ASTNode(this,&sStack_3a8,token);
                                                        }
                                                      }
                                                    }
                                                    goto LAB_0011ecf3;
                                                  }
                                                }
                                                this = (ASTNode *)operator_new(200);
                                                name = &local_328;
                                                std::__cxx11::string::string
                                                          ((string *)name,(string *)nodeName);
                                                Statements::Statements
                                                          ((Statements *)this,name,token);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011ecf3:
  std::__cxx11::string::~string((string *)name);
  return this;
}

Assistant:

AST::ASTNode *AST::ASTBuilder::createCustomNode(std::string &nodeName, Token *token) {
    if (nodeName == "add") return new AddOp(nodeName, token);
    else if (nodeName == "ARRAYDIMENSIONS") return new ArrayDim(nodeName, token);
    else if (nodeName == "=") return new AssignOp(nodeName, token);
    else if (nodeName == "calls") return new Calls(nodeName, token);
    else if (nodeName == "call") return new Call(nodeName, token);
    else if (nodeName == "classes") return new ClassDecls(nodeName, token);
    else if (nodeName == "class") return new ClassDecl(nodeName, token);
    else if (nodeName == "cmp") return new CompareOp(nodeName, token);
    else if (nodeName == "func_body") return new FuncBody(nodeName, token);
    else if (nodeName == "func_call") return new FuncCall(nodeName, token);
    else if (nodeName == "func_def") return new FuncDef(nodeName, token);
    else if (nodeName == "func_decl") return new FuncDecl(nodeName, token);
    else if (nodeName == "params") return new FuncParams(nodeName, token);
    else if (nodeName == "params_call") return new FuncCallParams(nodeName, token);
    else if (nodeName == "if") return new If(nodeName, token);
    else if (nodeName == "LOCALSCOPE") return new Local(nodeName, token);
    else if (nodeName == "main") return new MainFunc(nodeName, token);
    else if (nodeName == "mult") return new MultOp(nodeName, token);
    else if (nodeName == "number") return new Number(nodeName, token);
    else if (nodeName == "PROGRAM") return new Program(nodeName, token);
    else if (nodeName == "read") return new Read(nodeName, token);
    else if (nodeName == "return") return new Return(nodeName, token);
    else if (nodeName == "sign") return new Sign(nodeName, token);
    else if (nodeName == "STATEMENTS" || nodeName == "STATEMENTBLOCK") return new Statements(nodeName, token);
    else if (nodeName == "variable") return new VarDecl(nodeName, token);
    else if (nodeName == "while") return new While(nodeName, token);
    else if (nodeName == "write") return new Write(nodeName, token);
    else return new ASTNode(nodeName, token);
}